

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O2

void __thiscall
TorController::get_socks_cb(TorController *this,TorControlConnection *_conn,TorControlReply *reply)

{
  char cVar1;
  long lVar2;
  size_type sVar3;
  DNSLookupFn dns_lookup_function;
  DNSLookupFn dns_lookup_function_00;
  bool bVar4;
  int iVar5;
  Network NVar6;
  char *pcVar7;
  pointer pbVar8;
  TorController *this_00;
  Level level;
  Proxy *pPVar9;
  CService *this_01;
  undefined8 in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *portstr;
  pointer this_02;
  long lVar10;
  long lVar11;
  string *psVar12;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view str;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  undefined8 in_stack_fffffffffffffe98;
  TorController *in_stack_fffffffffffffea0;
  TorController *in_stack_fffffffffffffea8;
  _Invoker_type in_stack_fffffffffffffeb0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  onlynets;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  local_130;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  local_110;
  Proxy addrOnion;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  port_list;
  CService resolved;
  string socks_location;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  socks_location._M_dataplus._M_p = (pointer)&socks_location.field_2;
  socks_location._M_string_length = 0;
  socks_location.field_2._M_local_buf[0] = '\0';
  if (reply->code == 0x1fe) {
    pcVar7 = 
    "tor: Get SOCKS port command failed with unrecognized command (You probably should upgrade Tor)\n"
    ;
    iVar5 = 0x17f;
LAB_00335249:
    logging_function_01._M_str = "get_socks_cb";
    logging_function_01._M_len = 0xc;
    level = 0x6c0415;
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
    ;
    source_file_01._M_len = 0x5e;
    LogPrintFormatInternal<>
              (logging_function_01,source_file_01,iVar5,ALL,Info,(ConstevalFormatString<0U>)pcVar7);
  }
  else if (reply->code == 0xfa) {
    in_stack_fffffffffffffea0 =
         (TorController *)
         (reply->lines).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    for (this_00 = (TorController *)
                   (reply->lines).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; level = (Level)_conn,
        this_00 != in_stack_fffffffffffffea0;
        this_00 = (TorController *)((this_00->m_tor_control_center).field_2._M_local_buf + 8)) {
      _conn = (TorControlConnection *)0x0;
      this = this_00;
      iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,0
                      ,0x14,"net/listeners/socks=");
      if (iVar5 == 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addrOnion,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,0x14
                   ,0xffffffffffffffff);
        str._M_str = (char *)0x20;
        str._M_len = (size_t)addrOnion.proxy.super_CNetAddr.m_addr._union.indirect_contents.indirect
        ;
        _conn = (TorControlConnection *)addrOnion.proxy.super_CNetAddr.m_addr._union._8_8_;
        util::SplitString_abi_cxx11_
                  (&port_list,(util *)addrOnion.proxy.super_CNetAddr.m_addr._union._8_8_,str,
                   (char)in_R8);
        pbVar8 = port_list.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        in_stack_fffffffffffffea8 = this_00;
        for (this_02 = port_list.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; this_02 != pbVar8;
            this_02 = this_02 + 1) {
          sVar3 = this_02->_M_string_length;
          if (sVar3 != 0) {
            pcVar7 = (this_02->_M_dataplus)._M_p;
            cVar1 = *pcVar7;
            if ((((cVar1 == '\'') || (cVar1 == '\"')) && (sVar3 != 1)) &&
               (pcVar7[sVar3 - 1] == cVar1)) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&resolved,
                     this_02,1,sVar3 - 2);
              _conn = (TorControlConnection *)&resolved;
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(this_02,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&resolved);
              this_00 = in_stack_fffffffffffffea8;
              std::__cxx11::string::~string((string *)&resolved);
              in_stack_fffffffffffffea8 = this_00;
              if (this_02->_M_string_length == 0) goto LAB_0033517c;
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_assign(&socks_location,this_02);
            _conn = (TorControlConnection *)0x0;
            iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare(this_02,0,10,"127.0.0.1:");
            if (iVar5 == 0) break;
          }
LAB_0033517c:
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&port_list);
        this = (TorController *)&addrOnion;
        std::__cxx11::string::~string((string *)this);
      }
    }
    if (socks_location._M_string_length == 0) {
      pcVar7 = "tor: Get SOCKS port command returned nothing\n";
      iVar5 = 0x17c;
      goto LAB_00335249;
    }
    bVar4 = ::LogAcceptCategory((LogFlags)this,level);
    if (bVar4) {
      logging_function_00._M_str = "get_socks_cb";
      logging_function_00._M_len = 0xc;
      level = 0x6c0415;
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
      ;
      source_file_00._M_len = 0x5e;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function_00,source_file_00,0x17a,TOR,Debug,
                 (ConstevalFormatString<1U>)0x6c0422,&socks_location);
    }
  }
  else {
    logging_function._M_str = "get_socks_cb";
    logging_function._M_len = 0xc;
    level = 0x6c0415;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
    ;
    source_file._M_len = 0x5e;
    LogPrintFormatInternal<int>
              (logging_function,source_file,0x181,ALL,Info,(ConstevalFormatString<1U>)0x6c04d3,
               &reply->code);
  }
  CService::CService(&resolved);
  CNetAddr::IsValid(&resolved.super_CNetAddr);
  if (socks_location._M_string_length != 0) {
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::function(&local_110,&g_dns_lookup_abi_cxx11_);
    dns_lookup_function.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffea0;
    dns_lookup_function.super__Function_base._M_functor._M_unused._M_object =
         (void *)in_stack_fffffffffffffe98;
    dns_lookup_function.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffffea8;
    dns_lookup_function._M_invoker = in_stack_fffffffffffffeb0;
    LookupNumeric(&addrOnion.proxy,&socks_location,0x235a,dns_lookup_function);
    pPVar9 = &addrOnion;
    CService::operator=(&resolved,&addrOnion.proxy);
    level = (Level)pPVar9;
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addrOnion);
    std::_Function_base::~_Function_base(&local_110.super__Function_base);
  }
  bVar4 = CNetAddr::IsValid(&resolved.super_CNetAddr);
  if (!bVar4) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&port_list,"127.0.0.1",(allocator<char> *)&onlynets);
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::function(&local_130,&g_dns_lookup_abi_cxx11_);
    dns_lookup_function_00.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffea0;
    dns_lookup_function_00.super__Function_base._M_functor._M_unused._M_object =
         (void *)in_stack_fffffffffffffe98;
    dns_lookup_function_00.super__Function_base._M_manager =
         (_Manager_type)in_stack_fffffffffffffea8;
    dns_lookup_function_00._M_invoker = in_stack_fffffffffffffeb0;
    LookupNumeric(&addrOnion.proxy,(string *)&port_list,0x235a,dns_lookup_function_00);
    pPVar9 = &addrOnion;
    CService::operator=(&resolved,&addrOnion.proxy);
    level = (Level)pPVar9;
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addrOnion);
    std::_Function_base::~_Function_base(&local_130.super__Function_base);
    std::__cxx11::string::~string((string *)&port_list);
  }
  this_01 = &resolved;
  CNetAddr::IsValid(&this_01->super_CNetAddr);
  bVar4 = ::LogAcceptCategory((LogFlags)this_01,level);
  if (bVar4) {
    CService::ToStringAddrPort_abi_cxx11_((string *)&addrOnion,&resolved);
    logging_function_02._M_str = "get_socks_cb";
    logging_function_02._M_len = 0xc;
    source_file_02._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
    ;
    source_file_02._M_len = 0x5e;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function_02,source_file_02,399,TOR,Debug,(ConstevalFormatString<1U>)0x6c0510,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addrOnion);
    std::__cxx11::string::~string((string *)&addrOnion);
  }
  Proxy::Proxy(&addrOnion,&resolved,true);
  SetProxy(NET_ONION,&addrOnion);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&port_list,"-onlynet",(allocator<char> *)&stack0xfffffffffffffeb7);
  ArgsManager::GetArgs(&onlynets,&gArgs,(string *)&port_list);
  std::__cxx11::string::~string((string *)&port_list);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&port_list,"-onlynet",(allocator<char> *)&stack0xfffffffffffffeb7);
  bVar4 = ArgsManager::IsArgSet(&gArgs,(string *)&port_list);
  if (bVar4) {
    lVar10 = (long)onlynets.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)onlynets.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    pbVar8 = onlynets.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (lVar11 = lVar10 >> 7; 0 < lVar11; lVar11 = lVar11 + -1) {
      NVar6 = ParseNetwork(pbVar8);
      psVar12 = pbVar8;
      if (NVar6 == NET_ONION) goto LAB_00335539;
      NVar6 = ParseNetwork(pbVar8 + 1);
      psVar12 = pbVar8 + 1;
      if (NVar6 == NET_ONION) goto LAB_00335539;
      NVar6 = ParseNetwork(pbVar8 + 2);
      psVar12 = pbVar8 + 2;
      if (NVar6 == NET_ONION) goto LAB_00335539;
      NVar6 = ParseNetwork(pbVar8 + 3);
      psVar12 = pbVar8 + 3;
      if (NVar6 == NET_ONION) goto LAB_00335539;
      pbVar8 = pbVar8 + 4;
      lVar10 = lVar10 + -0x80;
    }
    lVar10 = lVar10 >> 5;
    if (lVar10 == 1) {
LAB_00335527:
      NVar6 = ParseNetwork(pbVar8);
      psVar12 = pbVar8;
      if (NVar6 != NET_ONION) {
        psVar12 = onlynets.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
    }
    else if (lVar10 == 2) {
LAB_00335516:
      NVar6 = ParseNetwork(pbVar8);
      psVar12 = pbVar8;
      if (NVar6 != NET_ONION) {
        pbVar8 = pbVar8 + 1;
        goto LAB_00335527;
      }
    }
    else {
      psVar12 = onlynets.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if ((lVar10 == 3) && (NVar6 = ParseNetwork(pbVar8), psVar12 = pbVar8, NVar6 != NET_ONION)) {
        pbVar8 = pbVar8 + 1;
        goto LAB_00335516;
      }
    }
LAB_00335539:
    std::__cxx11::string::~string((string *)&port_list);
    if (psVar12 ==
        onlynets.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0033555a;
  }
  else {
    std::__cxx11::string::~string((string *)&port_list);
  }
  ReachableNets::Add(&g_reachable_nets,NET_ONION);
LAB_0033555a:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&onlynets);
  Proxy::~Proxy(&addrOnion);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&resolved);
  std::__cxx11::string::~string((string *)&socks_location);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TorController::get_socks_cb(TorControlConnection& _conn, const TorControlReply& reply)
{
    // NOTE: We can only get here if -onion is unset
    std::string socks_location;
    if (reply.code == 250) {
        for (const auto& line : reply.lines) {
            if (0 == line.compare(0, 20, "net/listeners/socks=")) {
                const std::string port_list_str = line.substr(20);
                std::vector<std::string> port_list = SplitString(port_list_str, ' ');

                for (auto& portstr : port_list) {
                    if (portstr.empty()) continue;
                    if ((portstr[0] == '"' || portstr[0] == '\'') && portstr.size() >= 2 && (*portstr.rbegin() == portstr[0])) {
                        portstr = portstr.substr(1, portstr.size() - 2);
                        if (portstr.empty()) continue;
                    }
                    socks_location = portstr;
                    if (0 == portstr.compare(0, 10, "127.0.0.1:")) {
                        // Prefer localhost - ignore other ports
                        break;
                    }
                }
            }
        }
        if (!socks_location.empty()) {
            LogDebug(BCLog::TOR, "Get SOCKS port command yielded %s\n", socks_location);
        } else {
            LogPrintf("tor: Get SOCKS port command returned nothing\n");
        }
    } else if (reply.code == 510) {  // 510 Unrecognized command
        LogPrintf("tor: Get SOCKS port command failed with unrecognized command (You probably should upgrade Tor)\n");
    } else {
        LogPrintf("tor: Get SOCKS port command failed; error code %d\n", reply.code);
    }

    CService resolved;
    Assume(!resolved.IsValid());
    if (!socks_location.empty()) {
        resolved = LookupNumeric(socks_location, DEFAULT_TOR_SOCKS_PORT);
    }
    if (!resolved.IsValid()) {
        // Fallback to old behaviour
        resolved = LookupNumeric("127.0.0.1", DEFAULT_TOR_SOCKS_PORT);
    }

    Assume(resolved.IsValid());
    LogDebug(BCLog::TOR, "Configuring onion proxy for %s\n", resolved.ToStringAddrPort());
    Proxy addrOnion = Proxy(resolved, true);
    SetProxy(NET_ONION, addrOnion);

    const auto onlynets = gArgs.GetArgs("-onlynet");

    const bool onion_allowed_by_onlynet{
        !gArgs.IsArgSet("-onlynet") ||
        std::any_of(onlynets.begin(), onlynets.end(), [](const auto& n) {
            return ParseNetwork(n) == NET_ONION;
        })};

    if (onion_allowed_by_onlynet) {
        // If NET_ONION is reachable, then the below is a noop.
        //
        // If NET_ONION is not reachable, then none of -proxy or -onion was given.
        // Since we are here, then -torcontrol and -torpassword were given.
        g_reachable_nets.Add(NET_ONION);
    }
}